

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O1

void __thiscall
QPDF::getAllPagesInternal
          (QPDF *this,QPDFObjectHandle *cur_node,set *visited,set *seen,bool media_box)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  char cVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  QPDFObjGen QVar9;
  undefined7 extraout_var;
  iterator key;
  long *plVar10;
  QPDFExc *pQVar11;
  string *psVar12;
  ulong uVar13;
  double *pdVar14;
  size_type *psVar15;
  undefined7 in_register_00000081;
  uint uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  uint uVar18;
  string __str;
  QPDFObjectHandle kids;
  string local_158;
  undefined1 local_138 [36];
  uint local_114;
  string *local_110;
  QPDFObjectHandle local_108;
  undefined1 local_f8 [16];
  string local_e8;
  QPDFObjectHandle *local_c8;
  element_type *local_c0;
  uint local_b4;
  set *local_b0;
  BaseHandle local_a8;
  pointer local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  QPDFObjectHandle local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  QPDFObjectHandle *local_70;
  Array local_68;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  local_114 = (uint)CONCAT71(in_register_00000081,media_box);
  local_110 = (string *)cur_node;
  local_c8 = (QPDFObjectHandle *)this;
  local_c0 = (element_type *)seen;
  QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&cur_node->super_BaseHandle);
  local_b0 = visited;
  bVar7 = QPDFObjGen::set::add(visited,QVar9);
  if (!bVar7) {
    pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
    psVar12 = (string *)
              (**(code **)(**(long **)&(((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                            *)&(local_c8->super_BaseHandle).obj.
                                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         ).super__Head_base<0UL,_QPDF::Members_*,_false>.
                                        _M_head_impl)->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x18))();
    local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_110);
    QPDFObjGen::unparse_abi_cxx11_((string *)(local_f8 + 0x10),(QPDFObjGen *)&local_108,' ');
    std::operator+(&local_158,"object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f8 + 0x10));
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Loop detected in /Pages structure (getAllPages)","");
    QPDFExc::QPDFExc(pQVar11,qpdf_e_pages,psVar12,&local_158,0,(string *)local_138);
    __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  paVar17 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Pages","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_e8._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_f8 + 0x10),"");
  bVar7 = QPDFObjectHandle::isDictionaryOfType
                    ((QPDFObjectHandle *)local_110,&local_158,(string *)(local_f8 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar17) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    local_158._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"/Type key should be /Pages but is not; overriding","");
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_110,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar17) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Type","");
    operator____qpdf(local_f8 + 0x10,0x26b1e9);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_110,&local_158,(QPDFObjectHandle *)(local_f8 + 0x10));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar17) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)local_114 == '\0') {
    local_158._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/MediaBox","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_f8 + 0x10),local_110);
    bVar7 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)(local_f8 + 0x10));
    local_114 = (uint)CONCAT71(extraout_var,bVar7);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar17) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  local_158._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Kids","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_a8,local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar17) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&local_a8);
  bVar7 = QPDFObjGen::set::add(local_b0,QVar9);
  if (!bVar7) {
    pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
    psVar12 = (string *)
              (**(code **)(**(long **)&(((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                            *)&(local_c8->super_BaseHandle).obj.
                                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         ).super__Head_base<0UL,_QPDF::Members_*,_false>.
                                        _M_head_impl)->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x18))();
    local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_110);
    QPDFObjGen::unparse_abi_cxx11_((string *)(local_f8 + 0x10),(QPDFObjGen *)&local_108,' ');
    std::operator+(&local_158,"object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f8 + 0x10));
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Loop detected in /Pages structure (getAllPages)","");
    QPDFExc::QPDFExc(pQVar11,qpdf_e_pages,psVar12,&local_158,0,(string *)local_138);
    __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_68.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                    )0x0;
  key = ::qpdf::Array::begin(&local_68);
  local_70 = (QPDFObjectHandle *)::qpdf::Array::end(&local_68);
  if (key._M_current != local_70) {
    uVar16 = 0xffffffff;
    local_b4 = local_114 & 0xff;
    do {
      paVar17 = &local_158.field_2;
      bVar7 = QPDFObjectHandle::isDictionary(key._M_current);
      uVar16 = uVar16 + 1;
      local_158._M_dataplus._M_p = (pointer)paVar17;
      if (bVar7) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Kids","");
        bVar7 = QPDFObjectHandle::hasKey(key._M_current,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar17) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)(((string *)key._M_current)->_M_dataplus)._M_p;
          local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((string *)key._M_current)->_M_string_length;
          if (local_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_88.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_88.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_88.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_88.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          getAllPagesInternal((QPDF *)local_c8,&local_88,local_b0,(set *)local_c0,SUB41(local_b4,0))
          ;
          if (local_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        else {
          if ((char)local_114 == '\0') {
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_f8 + 0x10),"/MediaBox","");
            QPDFObjectHandle::getKey(&local_40,(string *)key._M_current);
            bVar7 = QPDFObjectHandle::isRectangle(&local_40);
            bVar7 = !bVar7;
          }
          else {
            bVar7 = false;
          }
          if ((char)local_114 == '\0') {
            if (local_40.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
          }
          cVar3 = (char)((int)uVar16 >> 0x1f);
          if (bVar7) {
            uVar2 = -uVar16;
            if (0 < (int)uVar16) {
              uVar2 = uVar16;
            }
            uVar18 = 1;
            if (9 < uVar2) {
              uVar13 = (ulong)uVar2;
              uVar6 = 4;
              do {
                uVar18 = uVar6;
                uVar8 = (uint)uVar13;
                if (uVar8 < 100) {
                  uVar18 = uVar18 - 2;
                  goto LAB_0023d406;
                }
                if (uVar8 < 1000) {
                  uVar18 = uVar18 - 1;
                  goto LAB_0023d406;
                }
                if (uVar8 < 10000) goto LAB_0023d406;
                uVar13 = uVar13 / 10000;
                uVar6 = uVar18 + 4;
              } while (99999 < uVar8);
              uVar18 = uVar18 + 1;
            }
LAB_0023d406:
            local_108.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_f8;
            std::__cxx11::string::_M_construct((ulong)&local_108,(char)uVar18 - cVar3);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar16 >> 0x1f) +
                               (long)local_108.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr),uVar18,uVar2);
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_108,0,(char *)0x0,0x2835c9);
            local_138._0_8_ = local_138 + 0x10;
            pdVar14 = (double *)(plVar10 + 2);
            paVar17 = &local_158.field_2;
            if ((double *)*plVar10 == pdVar14) {
              local_138._16_8_ = *pdVar14;
              local_138._24_8_ = plVar10[3];
            }
            else {
              local_138._16_8_ = *pdVar14;
              local_138._0_8_ = (double *)*plVar10;
            }
            local_138._8_8_ = plVar10[1];
            *plVar10 = (long)pdVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append(local_138);
            psVar15 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_158.field_2._M_allocated_capacity = *psVar15;
              local_158.field_2._8_8_ = plVar10[3];
              local_158._M_dataplus._M_p = (pointer)paVar17;
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar15;
              local_158._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_158._M_string_length = plVar10[1];
            *plVar10 = (long)psVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            QPDFObjectHandle::warnIfPossible(key._M_current,&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != paVar17) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
              operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
            }
            if (local_108.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)local_f8) {
              operator_delete(local_108.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              local_f8._0_8_ + 1);
            }
            local_158._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/MediaBox","");
            local_138._0_8_ = (double *)0x0;
            local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_138._16_8_ = 612.0;
            local_138._24_8_ = 792.0;
            QPDFObjectHandle::newArray(&local_108,(Rectangle *)local_138);
            QPDFObjectHandle::replaceKey(key._M_current,&local_158,&local_108);
            if (local_108.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_108.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != paVar17) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar7 = QPDFObjectHandle::isIndirect(key._M_current);
          if (bVar7) {
            QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                              (&(key._M_current)->super_BaseHandle);
            bVar7 = QPDFObjGen::set::add((set *)local_c0,QVar9);
            if (!bVar7) {
              uVar2 = -uVar16;
              if (0 < (int)uVar16) {
                uVar2 = uVar16;
              }
              uVar18 = 1;
              if (9 < uVar2) {
                uVar13 = (ulong)uVar2;
                uVar6 = 4;
                do {
                  uVar18 = uVar6;
                  uVar8 = (uint)uVar13;
                  if (uVar8 < 100) {
                    uVar18 = uVar18 - 2;
                    goto LAB_0023d8ad;
                  }
                  if (uVar8 < 1000) {
                    uVar18 = uVar18 - 1;
                    goto LAB_0023d8ad;
                  }
                  if (uVar8 < 10000) goto LAB_0023d8ad;
                  uVar13 = uVar13 / 10000;
                  uVar6 = uVar18 + 4;
                } while (99999 < uVar8);
                uVar18 = uVar18 + 1;
              }
LAB_0023d8ad:
              local_108.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_f8;
              std::__cxx11::string::_M_construct((ulong)&local_108,(char)uVar18 - cVar3);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((ulong)(uVar16 >> 0x1f) +
                                 (long)local_108.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr),uVar18,uVar2);
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_108,0,(char *)0x0,0x2835c9);
              local_138._0_8_ = local_138 + 0x10;
              pdVar14 = (double *)(plVar10 + 2);
              if ((double *)*plVar10 == pdVar14) {
                local_138._16_8_ = *pdVar14;
                local_138._24_8_ = plVar10[3];
              }
              else {
                local_138._16_8_ = *pdVar14;
                local_138._0_8_ = (double *)*plVar10;
              }
              local_138._8_8_ = plVar10[1];
              *plVar10 = (long)pdVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append(local_138);
              psVar15 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_158.field_2._M_allocated_capacity = *psVar15;
                local_158.field_2._8_8_ = plVar10[3];
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              }
              else {
                local_158.field_2._M_allocated_capacity = *psVar15;
                local_158._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_158._M_string_length = plVar10[1];
              *plVar10 = (long)psVar15;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_110,&local_158);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
                operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
              }
              if (local_108.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)local_f8) {
                operator_delete(local_108.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                local_f8._0_8_ + 1);
              }
              local_138._0_8_ = (((string *)key._M_current)->_M_dataplus)._M_p;
              local_138._8_8_ = ((string *)key._M_current)->_M_string_length;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_)->
                       _M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_)->
                       _M_use_count + 1;
                }
              }
              QPDFObjectHandle::shallowCopy(&local_50);
              makeIndirectObject((QPDF *)&local_158,local_c8);
              sVar5 = local_158._M_string_length;
              _Var4._M_p = local_158._M_dataplus._M_p;
              local_158._M_dataplus._M_p = (pointer)0x0;
              local_158._M_string_length = 0;
              p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((string *)key._M_current)->_M_string_length;
              (((string *)key._M_current)->_M_dataplus)._M_p = _Var4._M_p;
              ((string *)key._M_current)->_M_string_length = sVar5;
              if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_158._M_string_length);
              }
              if (local_50.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_50.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
              }
              QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                                (&(key._M_current)->super_BaseHandle);
              QPDFObjGen::set::add((set *)local_c0,QVar9);
            }
          }
          else {
            uVar2 = -uVar16;
            if (0 < (int)uVar16) {
              uVar2 = uVar16;
            }
            uVar18 = 1;
            if (9 < uVar2) {
              uVar13 = (ulong)uVar2;
              uVar6 = 4;
              do {
                uVar18 = uVar6;
                uVar8 = (uint)uVar13;
                if (uVar8 < 100) {
                  uVar18 = uVar18 - 2;
                  goto LAB_0023d6c6;
                }
                if (uVar8 < 1000) {
                  uVar18 = uVar18 - 1;
                  goto LAB_0023d6c6;
                }
                if (uVar8 < 10000) goto LAB_0023d6c6;
                uVar13 = uVar13 / 10000;
                uVar6 = uVar18 + 4;
              } while (99999 < uVar8);
              uVar18 = uVar18 + 1;
            }
LAB_0023d6c6:
            local_108.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_f8;
            std::__cxx11::string::_M_construct((ulong)&local_108,(char)uVar18 - cVar3);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar16 >> 0x1f) +
                               (long)local_108.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr),uVar18,uVar2);
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_108,0,(char *)0x0,0x2835c9);
            local_138._0_8_ = local_138 + 0x10;
            pdVar14 = (double *)(plVar10 + 2);
            if ((double *)*plVar10 == pdVar14) {
              local_138._16_8_ = *pdVar14;
              local_138._24_8_ = plVar10[3];
            }
            else {
              local_138._16_8_ = *pdVar14;
              local_138._0_8_ = (double *)*plVar10;
            }
            local_138._8_8_ = plVar10[1];
            *plVar10 = (long)pdVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append(local_138);
            psVar15 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_158.field_2._M_allocated_capacity = *psVar15;
              local_158.field_2._8_8_ = plVar10[3];
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar15;
              local_158._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_158._M_string_length = plVar10[1];
            *plVar10 = (long)psVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_110,&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
              operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
            }
            if (local_108.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)local_f8) {
              operator_delete(local_108.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              local_f8._0_8_ + 1);
            }
            local_98 = (((string *)key._M_current)->_M_dataplus)._M_p;
            local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((string *)key._M_current)->_M_string_length;
            if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_90->_M_use_count = local_90->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_90->_M_use_count = local_90->_M_use_count + 1;
              }
            }
            makeIndirectObject((QPDF *)&local_158,local_c8);
            sVar5 = local_158._M_string_length;
            _Var4._M_p = local_158._M_dataplus._M_p;
            local_158._M_dataplus._M_p = (pointer)0x0;
            local_158._M_string_length = 0;
            p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((string *)key._M_current)->_M_string_length;
            (((string *)key._M_current)->_M_dataplus)._M_p = _Var4._M_p;
            ((string *)key._M_current)->_M_string_length = sVar5;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length)
              ;
            }
            if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
            }
          }
          paVar17 = &local_158.field_2;
          local_158._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Page","");
          local_138._0_8_ = local_138 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
          bVar7 = QPDFObjectHandle::isDictionaryOfType
                            (key._M_current,&local_158,(string *)local_138);
          if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar17) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if (!bVar7) {
            local_158._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_158,"/Type key should be /Page but is not; overriding","");
            QPDFObjectHandle::warnIfPossible(key._M_current,&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != paVar17) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            local_158._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Type","");
            operator____qpdf((char *)local_138,0x27cfd2);
            QPDFObjectHandle::replaceKey(key._M_current,&local_158,(QPDFObjectHandle *)local_138);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != paVar17) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (&((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
                        &(local_c8->super_BaseHandle).obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->all_pages,
                     key._M_current);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"Pages tree includes non-dictionary object; ignoring","");
        QPDFObjectHandle::warnIfPossible(key._M_current,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar17) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        ((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
          &(local_c8->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>).
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->invalid_page_found = true;
      }
      key._M_current = (QPDFObjectHandle *)&((string *)key._M_current)->field_2;
    } while (key._M_current != local_70);
  }
  std::
  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ::~unique_ptr(&local_68.sp_elements);
  if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void
QPDF::getAllPagesInternal(
    QPDFObjectHandle cur_node, QPDFObjGen::set& visited, QPDFObjGen::set& seen, bool media_box)
{
    if (!visited.add(cur_node)) {
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            "object " + cur_node.getObjGen().unparse(' '),
            0,
            "Loop detected in /Pages structure (getAllPages)");
    }
    if (!cur_node.isDictionaryOfType("/Pages")) {
        cur_node.warnIfPossible("/Type key should be /Pages but is not; overriding");
        cur_node.replaceKey("/Type", "/Pages"_qpdf);
    }
    if (!media_box) {
        media_box = cur_node.getKey("/MediaBox").isRectangle();
        QTC::TC("qpdf", "QPDF inherit mediabox", media_box ? 0 : 1);
    }
    auto kids = cur_node.getKey("/Kids");
    if (!visited.add(kids)) {
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            "object " + cur_node.getObjGen().unparse(' '),
            0,
            "Loop detected in /Pages structure (getAllPages)");
    }
    int i = -1;
    for (auto& kid: kids.as_array()) {
        ++i;
        if (!kid.isDictionary()) {
            kid.warnIfPossible("Pages tree includes non-dictionary object; ignoring");
            m->invalid_page_found = true;
            continue;
        }
        if (kid.hasKey("/Kids")) {
            getAllPagesInternal(kid, visited, seen, media_box);
        } else {
            if (!media_box && !kid.getKey("/MediaBox").isRectangle()) {
                QTC::TC("qpdf", "QPDF missing mediabox");
                kid.warnIfPossible(
                    "kid " + std::to_string(i) +
                    " (from 0) MediaBox is undefined; setting to letter / ANSI A");
                kid.replaceKey(
                    "/MediaBox",
                    QPDFObjectHandle::newArray(QPDFObjectHandle::Rectangle(0, 0, 612, 792)));
            }
            if (!kid.isIndirect()) {
                QTC::TC("qpdf", "QPDF handle direct page object");
                cur_node.warnIfPossible(
                    "kid " + std::to_string(i) + " (from 0) is direct; converting to indirect");
                kid = makeIndirectObject(kid);
            } else if (!seen.add(kid)) {
                // Make a copy of the page. This does the same as shallowCopyPage in
                // QPDFPageObjectHelper.
                QTC::TC("qpdf", "QPDF resolve duplicated page object");
                cur_node.warnIfPossible(
                    "kid " + std::to_string(i) +
                    " (from 0) appears more than once in the pages tree;"
                    " creating a new page object as a copy");
                kid = makeIndirectObject(QPDFObjectHandle(kid).shallowCopy());
                seen.add(kid);
            }
            if (!kid.isDictionaryOfType("/Page")) {
                kid.warnIfPossible("/Type key should be /Page but is not; overriding");
                kid.replaceKey("/Type", "/Page"_qpdf);
            }
            m->all_pages.push_back(kid);
        }
    }
}